

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O0

void __thiscall SimpleParallelAnalyzer::DecodeBothEdges(SimpleParallelAnalyzer *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint64_t ending_sample;
  pointer pSVar5;
  uint64_t ending_sample_inclusive;
  uint64_t progress_update;
  U64 location;
  uint64_t uStack_28;
  bool found_next_edge;
  uint64_t previous_sample;
  uint16_t previous_value;
  anon_class_8_1_8991fb9c aStack_18;
  bool has_pending_frame;
  anon_class_8_1_8991fb9c advance_to_next_edge_or_fail;
  SimpleParallelAnalyzer *this_local;
  
  bVar1 = 0;
  previous_sample._4_2_ = 0;
  uStack_28 = 0;
  aStack_18.this = this;
  advance_to_next_edge_or_fail.this = this;
  do {
    bVar2 = DecodeBothEdges::anon_class_8_1_8991fb9c::operator()
                      (&stack0xffffffffffffffe8,(bool)(bVar1 ^ 1));
    ending_sample = AnalyzerChannelData::GetSampleNumber();
    ending_sample_inclusive = 0;
    if (bVar1 != 0) {
      ending_sample_inclusive = AddFrame(this,previous_sample._4_2_,uStack_28,ending_sample);
      bVar1 = 0;
    }
    if (bVar2) {
      bVar1 = 1;
      previous_sample._4_2_ = GetWordAtLocation(this,ending_sample);
      pSVar5 = std::
               unique_ptr<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ::operator->(&this->mResults);
      iVar3 = AnalyzerChannelData::GetBitState();
      uVar4 = 4;
      if (iVar3 == 0) {
        uVar4 = 5;
      }
      std::
      unique_ptr<SimpleParallelAnalyzerSettings,_std::default_delete<SimpleParallelAnalyzerSettings>_>
      ::operator->(&this->mSettings);
      AnalyzerResults::AddMarker
                ((ulonglong)pSVar5,(MarkerType)ending_sample,(Channel *)(ulong)uVar4);
      uStack_28 = ending_sample;
    }
    if (ending_sample_inclusive != 0) {
      Analyzer::ReportProgress((ulonglong)this);
    }
  } while( true );
}

Assistant:

void SimpleParallelAnalyzer::DecodeBothEdges()
{
    // helper to allow us to successfully report the last edge, even if there are no more edges in the capture.
    // Normally, in order to report a specific edge, the following edge must be found first.
    // If that following edge does not exist, and never will exist, instead we advance a intermediate amount, and return false.
    // If there is another edge, we advance to it and return true.
    // force_advance optionally ensures we advance to the next edge. If there are no more edges in the data, this will never return.
    auto advance_to_next_edge_or_fail = [&]( bool force_advance ) -> bool {
        if( mClock->DoMoreTransitionsExistInCurrentData() || force_advance )
        {
            mClock->AdvanceToNextEdge();
            return true;
        }
        int64_t estimated_frame_size = mLastFrameWidth > 0 ? std::max<int64_t>( static_cast<int64_t>( mLastFrameWidth * 0.1 ), 2 ) : 10;
        if( mClock->WouldAdvancingCauseTransition( estimated_frame_size ) )
        {
            // this condition will only be true if we're very lucky, and we're processing data while recording in real time.
            mClock->AdvanceToNextEdge();
            return true;
        }
        mClock->Advance( estimated_frame_size );
        return false;
    };

    // Frames start at the active edge, and extend to the following edge -1. (or they extend to an estimated width, if no more data is
    // found.)
    // we must advance past the active edge before committing the result from that edge.

    // has_pending_frame indicates that we have a word to store after the previous cycle.
    bool has_pending_frame = false;
    uint16_t previous_value = 0;
    uint64_t previous_sample = 0;

    for( ;; )
    {
        // advance to the next active edge.
        auto found_next_edge = advance_to_next_edge_or_fail( !has_pending_frame );
        auto location = mClock->GetSampleNumber();
        uint64_t progress_update = 0;
        if( has_pending_frame )
        {
            // store the previous frame.
            uint64_t ending_sample_inclusive = location;
            progress_update = AddFrame( previous_value, previous_sample, ending_sample_inclusive );
            has_pending_frame = false;
        }
        if( found_next_edge )
        {
            has_pending_frame = true;
            previous_sample = location;
            previous_value = GetWordAtLocation( location );

            mResults->AddMarker( location, mClock->GetBitState() == BIT_LOW ? AnalyzerResults::DownArrow : AnalyzerResults::UpArrow,
                                 mSettings->mClockChannel );
        }

        if( progress_update > 0 )
        {
            ReportProgress( progress_update );
        }
    }
}